

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseSkeletonElement
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,int iTime)

{
  pointer this_00;
  pointer pBVar1;
  pointer pMVar2;
  bool bVar3;
  Logger *this_01;
  ulong uVar4;
  char *msg;
  SMDImporter *this_02;
  uint iBone;
  aiMatrix4x4t<float> temp;
  char *local_f8;
  undefined8 local_f0;
  float local_e8 [2];
  undefined8 local_e0;
  float local_d8;
  uint local_d4;
  MatrixKey local_d0;
  
  local_e0 = 0;
  local_d8 = 0.0;
  local_f0 = 0;
  local_e8[0] = 0.0;
  local_d4 = 0;
  local_f8 = szCurrent;
  bVar3 = ParseUnsignedInt(this,szCurrent,&local_f8,&local_d4);
  if (bVar3) {
    uVar4 = (ulong)local_d4;
    pBVar1 = (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar4 < (ulong)(((long)(this->asBones).
                               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x90)) {
      this_02 = (SMDImporter *)&pBVar1[uVar4].sAnim.asKeys;
      local_d0.matrix.a1 = 1.0;
      local_d0.matrix.a2 = 0.0;
      local_d0.matrix.a3 = 0.0;
      local_d0.matrix.a4 = 0.0;
      local_d0.matrix.b1 = 0.0;
      local_d0.matrix.b2 = 1.0;
      local_d0.matrix.b3 = 0.0;
      local_d0.matrix.b4 = 0.0;
      local_d0.matrix.c1 = 0.0;
      local_d0.matrix.c2 = 0.0;
      local_d0.matrix.c3 = 1.0;
      local_d0.matrix.c4 = 0.0;
      local_d0.matrix.d1 = 0.0;
      local_d0.matrix.d2 = 0.0;
      local_d0.matrix.d3 = 0.0;
      local_d0.matrix.d4 = 1.0;
      local_d0.matrixAbsolute.a1 = 1.0;
      local_d0.matrixAbsolute.a2 = 0.0;
      local_d0.matrixAbsolute.a3 = 0.0;
      local_d0.matrixAbsolute.a4 = 0.0;
      local_d0.matrixAbsolute.b1 = 0.0;
      local_d0.matrixAbsolute.b2 = 1.0;
      local_d0.matrixAbsolute.b3 = 0.0;
      local_d0.matrixAbsolute.b4 = 0.0;
      local_d0.matrixAbsolute.c1 = 0.0;
      local_d0.matrixAbsolute.c2 = 0.0;
      local_d0.matrixAbsolute.c3 = 1.0;
      local_d0.matrixAbsolute.c4 = 0.0;
      local_d0.matrixAbsolute.d1 = 0.0;
      local_d0.matrixAbsolute.d2 = 0.0;
      local_d0.matrixAbsolute.d3 = 0.0;
      local_d0.matrixAbsolute.d4 = 1.0;
      local_d0.vPos.x = 0.0;
      local_d0.vPos.y = 0.0;
      local_d0.vPos.z = 0.0;
      local_d0.vRot.x = 0.0;
      local_d0.vRot.y = 0.0;
      local_d0.vRot.z = 0.0;
      local_d0.dTime = 0.0;
      std::
      vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
      ::emplace_back<Assimp::SMD::Bone::Animation::MatrixKey>
                ((vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  *)this_02,&local_d0);
      pMVar2 = *(pointer *)
                ((long)&pBVar1[uVar4].sAnim.asKeys.
                        super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                + 8);
      pMVar2[-1].dTime = (double)iTime;
      bVar3 = ParseFloat(this_02,local_f8,&local_f8,(float *)&local_e0);
      if (bVar3) {
        bVar3 = ParseFloat(this_02,local_f8,&local_f8,(float *)((long)&local_e0 + 4));
        if (bVar3) {
          bVar3 = ParseFloat(this_02,local_f8,&local_f8,&local_d8);
          if (bVar3) {
            bVar3 = ParseFloat(this_02,local_f8,&local_f8,(float *)&local_f0);
            if (bVar3) {
              bVar3 = ParseFloat(this_02,local_f8,&local_f8,(float *)((long)&local_f0 + 4));
              if (bVar3) {
                bVar3 = ParseFloat(this_02,local_f8,&local_f8,local_e8);
                if (bVar3) {
                  this_00 = pMVar2 + -1;
                  aiMatrix4x4t<float>::FromEulerAnglesXYZ
                            (&this_00->matrix,(float)local_f0,local_f0._4_4_,local_e8[0]);
                  local_d0.matrix.a1 = 1.0;
                  local_d0.matrix.a2 = 0.0;
                  local_d0.matrix.a3 = 0.0;
                  local_d0.matrix.a4 = (float)local_e0;
                  local_d0.matrix.b1 = 0.0;
                  local_d0.matrix.b2 = 1.0;
                  local_d0.matrix._24_8_ = local_e0 & 0xffffffff00000000;
                  local_d0.matrix.c1 = 0.0;
                  local_d0.matrix.c2 = 0.0;
                  local_d0.matrix.c3 = 1.0;
                  local_d0.matrix.c4 = local_d8;
                  local_d0.matrix.d3 = 0.0;
                  local_d0.matrix.d4 = 1.0;
                  local_d0.matrix.d1 = 0.0;
                  local_d0.matrix.d2 = 0.0;
                  aiMatrix4x4t<float>::operator*=(&local_d0.matrix,&this_00->matrix);
                  pMVar2[-1].matrix.d1 = local_d0.matrix.d1;
                  pMVar2[-1].matrix.d2 = local_d0.matrix.d2;
                  pMVar2[-1].matrix.d3 = local_d0.matrix.d3;
                  pMVar2[-1].matrix.d4 = local_d0.matrix.d4;
                  pMVar2[-1].matrix.c1 = local_d0.matrix.c1;
                  pMVar2[-1].matrix.c2 = local_d0.matrix.c2;
                  pMVar2[-1].matrix.c3 = local_d0.matrix.c3;
                  pMVar2[-1].matrix.c4 = local_d0.matrix.c4;
                  pMVar2[-1].matrix.b1 = local_d0.matrix.b1;
                  pMVar2[-1].matrix.b2 = local_d0.matrix.b2;
                  pMVar2[-1].matrix.b3 = local_d0.matrix.b3;
                  pMVar2[-1].matrix.b4 = local_d0.matrix.b4;
                  (this_00->matrix).a1 = local_d0.matrix.a1;
                  (this_00->matrix).a2 = local_d0.matrix.a2;
                  pMVar2[-1].matrix.a3 = local_d0.matrix.a3;
                  pMVar2[-1].matrix.a4 = local_d0.matrix.a4;
                  pMVar2[-1].vPos.z = local_d8;
                  pMVar2[-1].vPos.x = (float)local_e0;
                  pMVar2[-1].vPos.y = (float)local_e0._4_4_;
                  pMVar2[-1].vRot.x = (float)local_f0;
                  pMVar2[-1].vRot.y = local_f0._4_4_;
                  pMVar2[-1].vRot.z = local_e8[0];
                  goto LAB_00532a2d;
                }
                msg = "Unexpected EOF/EOL while parsing bone.rot.z";
              }
              else {
                msg = "Unexpected EOF/EOL while parsing bone.rot.y";
              }
            }
            else {
              msg = "Unexpected EOF/EOL while parsing bone.rot.x";
            }
          }
          else {
            msg = "Unexpected EOF/EOL while parsing bone.pos.z";
          }
        }
        else {
          msg = "Unexpected EOF/EOL while parsing bone.pos.y";
        }
      }
      else {
        msg = "Unexpected EOF/EOL while parsing bone.pos.x";
      }
    }
    else {
      msg = "Bone index in skeleton section is out of range";
    }
    LogErrorNoThrow(this,msg);
  }
  else {
    this_01 = DefaultLogger::get();
    Logger::error(this_01,"Unexpected EOF/EOL while parsing bone index");
  }
LAB_00532a2d:
  SkipLine(this,local_f8,&local_f8);
  *szCurrentOut = local_f8;
  return;
}

Assistant:

void SMDImporter::ParseSkeletonElement(const char* szCurrent, const char** szCurrentOut,int iTime) {
    aiVector3D vPos;
    aiVector3D vRot;

    unsigned int iBone  = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iBone)) {
        ASSIMP_LOG_ERROR("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    if (iBone >= asBones.size()) {
        LogErrorNoThrow("Bone index in skeleton section is out of range");
        SMDI_PARSE_RETURN;
    }
    SMD::Bone& bone = asBones[iBone];

    bone.sAnim.asKeys.push_back(SMD::Bone::Animation::MatrixKey());
    SMD::Bone::Animation::MatrixKey& key = bone.sAnim.asKeys.back();

    key.dTime = (double)iTime;
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vPos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vRot.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone.rot.z");
        SMDI_PARSE_RETURN;
    }
    // build the transformation matrix of the key
    key.matrix.FromEulerAnglesXYZ(vRot.x,vRot.y,vRot.z); {
        aiMatrix4x4 mTemp;
        mTemp.a4 = vPos.x;
        mTemp.b4 = vPos.y;
        mTemp.c4 = vPos.z;
        key.matrix = mTemp * key.matrix;
    }
    key.vPos = vPos;
    key.vRot = vRot;
    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}